

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O1

bool __thiscall
Jinx::Impl::Parser::CheckProperty(Parser *this,SymbolListCItr currSym,size_t *symCount)

{
  element_type *peVar1;
  undefined8 this_00;
  bool bVar2;
  bool bVar3;
  SymbolListCItr currSym_00;
  pointer pbVar4;
  LibraryIPtr library;
  String libraryName;
  undefined1 local_b0 [24];
  LibraryIPtr local_98;
  LibraryIPtr local_88;
  LibraryIPtr local_78;
  SymbolListCItr local_68;
  size_t *local_60;
  pointer local_58;
  String local_50;
  
  if (((this->m_error == false) &&
      ((this->m_symbolList->
       super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl.
       super__Vector_impl_data._M_finish != currSym._M_current)) &&
     ((currSym._M_current)->type == NameValue)) {
    CheckLibraryName_abi_cxx11_(&local_50,this);
    if (local_50._M_string_length == 0) {
      local_88.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (this->m_library).super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      if (local_88.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        __assert_fail("m_library",
                      "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Source/JxParser.cpp"
                      ,0x34c,
                      "bool Jinx::Impl::Parser::CheckProperty(SymbolListCItr, size_t *) const");
      }
      local_88.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (this->m_library).super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
      if (local_88.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_88.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_88.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_88.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_88.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      bVar2 = CheckPropertyName(this,&local_88,currSym,symCount);
      local_68._M_current = currSym._M_current;
      local_60 = symCount;
      if (local_88.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_88.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      bVar3 = true;
      if (!bVar2) {
        pbVar4 = (this->m_importList).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_58 = (this->m_importList).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        bVar2 = pbVar4 == local_58;
        while (bVar3 = !bVar2, !bVar2) {
          Runtime::GetLibrary((Runtime *)local_b0,
                              (String *)
                              (this->m_runtime).
                              super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
          this_00 = local_b0._8_8_;
          if ((element_type *)local_b0._8_8_ != (element_type *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)(local_b0._8_8_ + 8))->
                       _M_weak_this).
                       super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)(local_b0._8_8_ + 8))
                            ->_M_weak_this).
                            super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   + 1;
              UNLOCK();
            }
            else {
              *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)(local_b0._8_8_ + 8))->
                       _M_weak_this).
                       super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)(local_b0._8_8_ + 8))
                            ->_M_weak_this).
                            super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   + 1;
            }
          }
          local_b0._16_8_ = local_b0._0_8_;
          if ((element_type *)local_b0._8_8_ != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_);
          }
          peVar1 = (this->m_library).
                   super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if ((element_type *)local_b0._16_8_ == peVar1) {
            bVar2 = false;
          }
          else {
            local_98.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_b0._16_8_;
            local_98.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00;
            if ((element_type *)this_00 != (element_type *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)(this_00 + 8))->
                         _M_weak_this).
                         super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)(this_00 + 8))->
                              _M_weak_this).
                              super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 1;
                UNLOCK();
              }
              else {
                *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)(this_00 + 8))->
                         _M_weak_this).
                         super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)(this_00 + 8))->
                              _M_weak_this).
                              super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 1;
              }
            }
            bVar2 = CheckPropertyName(this,&local_98,local_68,local_60);
          }
          if (((element_type *)local_b0._16_8_ != peVar1) &&
             ((element_type *)
              local_98.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (element_type *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_98.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if ((element_type *)this_00 != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
          }
          if (bVar2 != false) break;
          pbVar4 = pbVar4 + 1;
          bVar2 = pbVar4 == local_58;
        }
      }
    }
    else {
      currSym_00._M_current = currSym._M_current + 1;
      if ((currSym_00._M_current ==
           (this->m_symbolList->
           super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl.
           super__Vector_impl_data._M_finish) || ((currSym_00._M_current)->type != NameValue)) {
        bVar3 = false;
      }
      else {
        Runtime::GetLibraryInternal
                  ((Runtime *)local_b0,
                   (String *)
                   (this->m_runtime).
                   super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        if ((element_type *)local_b0._0_8_ == (element_type *)0x0) {
          __assert_fail("library",
                        "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Source/JxParser.cpp"
                        ,0x347,
                        "bool Jinx::Impl::Parser::CheckProperty(SymbolListCItr, size_t *) const");
        }
        local_78.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_b0._0_8_;
        local_78.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_;
        if ((element_type *)local_b0._8_8_ != (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)(local_b0._8_8_ + 8))->
                     _M_weak_this).super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr =
                 *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)(local_b0._8_8_ + 8))->
                          _M_weak_this).
                          super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                 1;
            UNLOCK();
          }
          else {
            *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)(local_b0._8_8_ + 8))->
                     _M_weak_this).super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr =
                 *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)(local_b0._8_8_ + 8))->
                          _M_weak_this).
                          super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                 1;
          }
        }
        bVar3 = CheckPropertyName(this,&local_78,currSym_00,symCount);
        if ((element_type *)
            local_78.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_78.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if ((element_type *)local_b0._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_);
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      MemFree(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

inline_t bool Parser::CheckProperty(SymbolListCItr currSym, size_t * symCount) const
	{
		// Check symbol validity
		if (m_error || currSym == m_symbolList.end())
			return false;
		if (currSym->type != SymbolType::NameValue)
			return false;

		// Check to see if this begins with a library name
		String libraryName = CheckLibraryName();
		if (!libraryName.empty())
		{
			// Get next symbol and check validity
			auto currentSymbol = currSym;
			++currentSymbol;
			if (currentSymbol == m_symbolList.end())
				return false;
			if (currentSymbol->type != SymbolType::NameValue)
				return false;

			// Check for property name in this specific library
			auto library = m_runtime->GetLibraryInternal(libraryName);
			assert(library);
			return CheckPropertyName(library, currentSymbol, symCount);
		}

		// Check for property name in the current library
		assert(m_library);
		if (CheckPropertyName(m_library, currSym, symCount))
			return true;

		// Check against all imported libraries
		for (auto & importName : m_importList)
		{
			auto library = m_runtime->GetLibraryInternal(importName);
			if (library != m_library && CheckPropertyName(library, currSym, symCount))
				return true;
		}
		return false;
	}